

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O2

void __thiscall
QSharedMemorySystemV::updateNativeKeyFile(QSharedMemorySystemV *this,QNativeIpcKey *nativeKey)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (nativeKey->key).d.d;
  local_38.ptr = (nativeKey->key).d.ptr;
  lVar1 = (nativeKey->key).d.size;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38.size = lVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (lVar1 != 0) {
    local_50.d = (nativeKey->key).d.d;
    local_50.ptr = (nativeKey->key).d.ptr;
    local_50.size = (nativeKey->key).d.size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::toLocal8Bit((QByteArray *)&local_38,(QString *)&local_50);
    pDVar2 = (Data *)(this->nativeKeyFile).d.d;
    pcVar3 = (char16_t *)(this->nativeKeyFile).d.ptr;
    (this->nativeKeyFile).d.d = (Data *)local_38.d;
    (this->nativeKeyFile).d.ptr = (char *)local_38.ptr;
    lVar1 = (this->nativeKeyFile).d.size;
    (this->nativeKeyFile).d.size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_38.size = lVar1;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QSharedMemorySystemV::updateNativeKeyFile(const QNativeIpcKey &nativeKey)
{
    Q_ASSERT(nativeKeyFile.isEmpty() );
    if (!nativeKey.nativeKey().isEmpty())
        nativeKeyFile = QFile::encodeName(nativeKey.nativeKey());
}